

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O1

int coda_mem_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  coda_dynamic_type_struct *pcVar1;
  int iVar2;
  int iVar3;
  coda_cursor sub_cursor;
  coda_cursor local_320;
  
  pcVar1 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar1[1].backend == 2) {
    if (pcVar1->definition->format == coda_format_ascii) {
      iVar2 = coda_ascii_cursor_get_bit_size(cursor,bit_size);
    }
    else {
      iVar2 = coda_bin_cursor_get_bit_size(cursor,bit_size);
    }
    iVar3 = -1;
    if (iVar2 == 0) {
      iVar3 = 0;
      if (*bit_size < 0) {
        *bit_size = *(long *)(pcVar1 + 2) << 3;
        iVar3 = 0;
      }
    }
  }
  else if (pcVar1[1].backend == 3) {
    memcpy(&local_320,cursor,0x310);
    iVar2 = coda_cursor_use_base_type_of_special_type(&local_320);
    iVar3 = -1;
    if (iVar2 == 0) {
      iVar3 = coda_cursor_get_bit_size(&local_320,bit_size);
    }
  }
  else {
    *bit_size = -1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int coda_mem_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_special)
    {
        coda_cursor sub_cursor = *cursor;

        if (coda_cursor_use_base_type_of_special_type(&sub_cursor) != 0)
        {
            return -1;
        }
        return coda_cursor_get_bit_size(&sub_cursor, bit_size);
    }

    if (type->tag == tag_mem_data)
    {
        if (type->definition->format == coda_format_ascii)
        {
            if (coda_ascii_cursor_get_bit_size(cursor, bit_size) != 0)
            {
                return -1;
            }
        }
        else if (coda_bin_cursor_get_bit_size(cursor, bit_size) != 0)
        {
            return -1;
        }
        if (*bit_size < 0)
        {
            *bit_size = 8 * ((coda_mem_data *)type)->length;
        }
    }
    else
    {
        *bit_size = -1;
    }

    return 0;
}